

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

void uhash_close_63(UHashtable *hash)

{
  UHashElement *pUVar1;
  UHashElement *pUVar2;
  UHashElement *buffer;
  long lVar3;
  
  if (hash != (UHashtable *)0x0) {
    buffer = hash->elements;
    if (buffer != (UHashElement *)0x0) {
      if ((hash->keyDeleter != (UObjectDeleter *)0x0) ||
         (hash->valueDeleter != (UObjectDeleter *)0x0)) {
        lVar3 = -1;
        do {
          lVar3 = (long)(int)lVar3;
          buffer = hash->elements;
          pUVar2 = buffer + lVar3;
          do {
            pUVar1 = pUVar2;
            lVar3 = lVar3 + 1;
            if (hash->length <= lVar3) goto LAB_0010d398;
            pUVar2 = pUVar1 + 1;
          } while (pUVar1[1].hashcode < 0);
          if ((hash->keyDeleter != (UObjectDeleter *)0x0) && (pUVar1[1].key.pointer != (void *)0x0))
          {
            (*hash->keyDeleter)(pUVar1[1].key.pointer);
          }
          if ((hash->valueDeleter != (UObjectDeleter *)0x0) &&
             (pUVar1[1].value.pointer != (void *)0x0)) {
            (*hash->valueDeleter)(pUVar1[1].value.pointer);
          }
        } while( true );
      }
LAB_0010d398:
      uprv_free_63(buffer);
      hash->elements = (UHashElement *)0x0;
    }
    if (hash->allocated != '\0') {
      uprv_free_63(hash);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_close(UHashtable *hash) {
    if (hash == NULL) {
        return;
    }
    if (hash->elements != NULL) {
        if (hash->keyDeleter != NULL || hash->valueDeleter != NULL) {
            int32_t pos=UHASH_FIRST;
            UHashElement *e;
            while ((e = (UHashElement*) uhash_nextElement(hash, &pos)) != NULL) {
                HASH_DELETE_KEY_VALUE(hash, e->key.pointer, e->value.pointer);
            }
        }
        uprv_free(hash->elements);
        hash->elements = NULL;
    }
    if (hash->allocated) {
        uprv_free(hash);
    }
}